

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O1

void __thiscall
AbstractTransaction_SetUnlockingScript_Test::~AbstractTransaction_SetUnlockingScript_Test
          (AbstractTransaction_SetUnlockingScript_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AbstractTransaction, SetUnlockingScript) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  // error
  EXPECT_THROW(tx.SetUnlockingScript(3, Script()), CfdException);
  EXPECT_THROW(tx.SetUnlockingScript(0, Script("61")), CfdException);

  EXPECT_NO_THROW(
      tx.SetUnlockingScript(
          0,
          Script(
              "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763")));

  EXPECT_STREQ(
      tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str(),
      "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
}